

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

bool absl::numbers_internal::safe_strtou32_base(string_view text,Nonnull<uint32_t_*> value,int base)

{
  string_view text_00;
  bool bVar1;
  undefined4 in_ECX;
  char *in_RDX;
  Nonnull<unsigned_int_*> in_RSI;
  undefined8 in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  
  text_00._M_len._4_4_ = in_ECX;
  text_00._M_len._0_4_ = in_stack_ffffffffffffffe0;
  text_00._M_str = in_RDX;
  bVar1 = anon_unknown_0::safe_uint_internal<unsigned_int>
                    (text_00,in_RSI,(int)((ulong)in_RDI >> 0x20));
  return bVar1;
}

Assistant:

bool safe_strtou32_base(absl::string_view text, absl::Nonnull<uint32_t*> value,
                        int base) {
  return safe_uint_internal<uint32_t>(text, value, base);
}